

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O3

Aig_Obj_t ** Fra_RefineClassOne(Fra_Cla_t *p,Aig_Obj_t **ppClass)

{
  uint uVar1;
  int iVar2;
  void **ppvVar3;
  long lVar4;
  Vec_Ptr_t *pVVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t **ppAVar8;
  
  if ((*ppClass != (Aig_Obj_t *)0x0) && (pAVar7 = ppClass[1], pAVar7 != (Aig_Obj_t *)0x0)) {
    ppAVar8 = ppClass + 2;
    do {
      iVar2 = (*p->pFuncNodesAreEqual)(*ppClass,pAVar7);
      if (iVar2 == 0) {
        pVVar5 = p->vClassOld;
        pVVar5->nSize = 0;
        p->vClassNew->nSize = 0;
        pAVar7 = *ppClass;
        uVar1 = pVVar5->nSize;
        if (uVar1 == pVVar5->nCap) {
          if ((int)uVar1 < 0x10) {
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(0x80);
            }
            else {
              ppvVar3 = (void **)realloc(pVVar5->pArray,0x80);
            }
            pVVar5->pArray = ppvVar3;
            pVVar5->nCap = 0x10;
          }
          else {
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
            }
            else {
              ppvVar3 = (void **)realloc(pVVar5->pArray,(ulong)uVar1 << 4);
            }
            pVVar5->pArray = ppvVar3;
            pVVar5->nCap = uVar1 * 2;
          }
        }
        else {
          ppvVar3 = pVVar5->pArray;
        }
        iVar2 = pVVar5->nSize;
        pVVar5->nSize = iVar2 + 1;
        ppvVar3[iVar2] = pAVar7;
        pAVar7 = ppClass[1];
        if (pAVar7 != (Aig_Obj_t *)0x0) {
          ppAVar8 = ppClass + 2;
          do {
            iVar2 = (*p->pFuncNodesAreEqual)(*ppClass,pAVar7);
            if (iVar2 == 0) {
              pVVar5 = p->vClassNew;
            }
            else {
              pVVar5 = p->vClassOld;
            }
            uVar1 = pVVar5->nSize;
            if (uVar1 == pVVar5->nCap) {
              if ((int)uVar1 < 0x10) {
                if (pVVar5->pArray == (void **)0x0) {
                  ppvVar3 = (void **)malloc(0x80);
                }
                else {
                  ppvVar3 = (void **)realloc(pVVar5->pArray,0x80);
                }
                pVVar5->pArray = ppvVar3;
                pVVar5->nCap = 0x10;
              }
              else {
                if (pVVar5->pArray == (void **)0x0) {
                  ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
                }
                else {
                  ppvVar3 = (void **)realloc(pVVar5->pArray,(ulong)uVar1 << 4);
                }
                pVVar5->pArray = ppvVar3;
                pVVar5->nCap = uVar1 * 2;
              }
            }
            else {
              ppvVar3 = pVVar5->pArray;
            }
            iVar2 = pVVar5->nSize;
            pVVar5->nSize = iVar2 + 1;
            ppvVar3[iVar2] = pAVar7;
            pAVar7 = *ppAVar8;
            ppAVar8 = ppAVar8 + 1;
          } while (pAVar7 != (Aig_Obj_t *)0x0);
        }
        pVVar5 = p->vClassOld;
        iVar2 = pVVar5->nSize;
        if (0 < iVar2) {
          lVar4 = 0;
          do {
            pAVar7 = (Aig_Obj_t *)pVVar5->pArray[lVar4];
            ppClass[lVar4] = pAVar7;
            ppClass[p->vClassOld->nSize + lVar4] = (Aig_Obj_t *)0x0;
            if (lVar4 == 0) {
              pAVar6 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar6 = *ppClass;
            }
            *(Aig_Obj_t **)
             (*(long *)(*(long *)((long)(pAVar7->field_5).pData + 0x30) + 8) + (long)pAVar7->Id * 8)
                 = pAVar6;
            lVar4 = lVar4 + 1;
            pVVar5 = p->vClassOld;
            iVar2 = pVVar5->nSize;
          } while (lVar4 < iVar2);
        }
        ppAVar8 = ppClass + iVar2 * 2;
        pVVar5 = p->vClassNew;
        if (0 < pVVar5->nSize) {
          lVar4 = 0;
          do {
            pAVar7 = (Aig_Obj_t *)pVVar5->pArray[lVar4];
            ppAVar8[lVar4] = pAVar7;
            ppAVar8[p->vClassNew->nSize + lVar4] = (Aig_Obj_t *)0x0;
            if (lVar4 == 0) {
              pAVar6 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar6 = *ppAVar8;
            }
            *(Aig_Obj_t **)
             (*(long *)(*(long *)((long)(pAVar7->field_5).pData + 0x30) + 8) + (long)pAVar7->Id * 8)
                 = pAVar6;
            lVar4 = lVar4 + 1;
            pVVar5 = p->vClassNew;
          } while (lVar4 < pVVar5->nSize);
        }
        return ppAVar8;
      }
      pAVar7 = *ppAVar8;
      ppAVar8 = ppAVar8 + 1;
    } while (pAVar7 != (Aig_Obj_t *)0x0);
    return (Aig_Obj_t **)0x0;
  }
  __assert_fail("ppClass[0] != NULL && ppClass[1] != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClass.c"
                ,0x192,"Aig_Obj_t **Fra_RefineClassOne(Fra_Cla_t *, Aig_Obj_t **)");
}

Assistant:

Aig_Obj_t ** Fra_RefineClassOne( Fra_Cla_t * p, Aig_Obj_t ** ppClass )
{
    Aig_Obj_t * pObj, ** ppThis;
    int i;
    assert( ppClass[0] != NULL && ppClass[1] != NULL );

    // check if the class is going to be refined
    for ( ppThis = ppClass + 1; (pObj = *ppThis); ppThis++ )        
        if ( !p->pFuncNodesAreEqual(ppClass[0], pObj) )
            break;
    if ( pObj == NULL )
        return NULL;
    // split the class
    Vec_PtrClear( p->vClassOld );
    Vec_PtrClear( p->vClassNew );
    Vec_PtrPush( p->vClassOld, ppClass[0] );
    for ( ppThis = ppClass + 1; (pObj = *ppThis); ppThis++ )        
        if ( p->pFuncNodesAreEqual(ppClass[0], pObj) )
            Vec_PtrPush( p->vClassOld, pObj );
        else
            Vec_PtrPush( p->vClassNew, pObj );
/*
    printf( "Refining class (" );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassOld, pObj, i )
        printf( "%d,", pObj->Id );
    printf( ") + (" );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassNew, pObj, i )
        printf( "%d,", pObj->Id );
    printf( ")\n" );
*/
    // put the nodes back into the class memory
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassOld, pObj, i )
    {
        ppClass[i] = pObj;
        ppClass[Vec_PtrSize(p->vClassOld)+i] = NULL;
        Fra_ClassObjSetRepr( pObj, i? ppClass[0] : NULL );
    }
    ppClass += 2*Vec_PtrSize(p->vClassOld);
    // put the new nodes into the class memory
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassNew, pObj, i )
    {
        ppClass[i] = pObj;
        ppClass[Vec_PtrSize(p->vClassNew)+i] = NULL;
        Fra_ClassObjSetRepr( pObj, i? ppClass[0] : NULL );
    }
    return ppClass;
}